

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateFunctionAccess(ExpressionEvalContext *ctx,ExprFunctionAccess *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  TypeFunction *pTVar4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  ExprBase *value;
  FunctionData *pFVar9;
  undefined4 extraout_var_00;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar7)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar2;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
    return pEVar8;
  }
  bVar5 = AddInstruction(ctx);
  if ((bVar5) && (pEVar8 = Evaluate(ctx,expression->context), pEVar8 != (ExprBase *)0x0)) {
    pFVar9 = expression->function->implementation;
    if (pFVar9 == (FunctionData *)0x0) {
      pFVar9 = expression->function;
    }
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
    value = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar4 = pFVar9->type;
    value->typeID = 0xb;
    value->source = pSVar2;
    value->type = &pTVar4->super_TypeBase;
    value->next = (ExprBase *)0x0;
    value->listed = false;
    value->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223608;
    value[1]._vptr_ExprBase = (_func_int **)pFVar9;
    *(ExprBase **)&value[1].typeID = pEVar8;
    pEVar8 = CheckType(&expression->super_ExprBase,value);
    return pEVar8;
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateFunctionAccess(ExpressionEvalContext &ctx, ExprFunctionAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *context = Evaluate(ctx, expression->context);

	if(!context)
		return NULL;

	FunctionData *function = expression->function;

	if(function->implementation)
		function = function->implementation;

	return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, function->type, function, context));
}